

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O0

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::splitFrom
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *find,bool includeFind)

{
  byte in_CL;
  uint uVar1;
  undefined7 in_register_00000011;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar2;
  VerySimpleReadOnlyString VVar3;
  uint local_6c;
  int size;
  uint pos;
  bool includeFind_local;
  VerySimpleReadOnlyString *find_local;
  VerySimpleReadOnlyString *this_local;
  VerySimpleReadOnlyString *ret;
  
  local_6c = Find(find,(VerySimpleReadOnlyString *)CONCAT71(in_register_00000011,includeFind),0);
  if (local_6c == find->length) {
    if ((in_CL & 1) == 0) {
      VerySimpleReadOnlyString(this,"",0);
      uVar2 = extraout_RDX_00;
    }
    else {
      VerySimpleReadOnlyString(this,find);
      Mutate(find,find->data + find->length,0);
      uVar2 = extraout_RDX;
    }
  }
  else {
    uVar1 = local_6c +
            ((VerySimpleReadOnlyString *)CONCAT71(in_register_00000011,includeFind))->length;
    if ((in_CL & 1) != 0) {
      local_6c = uVar1;
    }
    VerySimpleReadOnlyString(this,find->data,local_6c);
    Mutate(find,find->data + (int)uVar1,find->length - uVar1);
    uVar2 = extraout_RDX_01;
  }
  VVar3._8_8_ = uVar2;
  VVar3.data = (tCharPtr)this;
  return VVar3;
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::splitFrom(const VerySimpleReadOnlyString & find, const bool includeFind)
	{
	    const unsigned int pos = Find(find);
	    if (pos == (unsigned int)length)
	    {
	        if (includeFind)
	        {
	            VerySimpleReadOnlyString ret(*this);
                (void)Mutate(data + length, 0);
	            return ret;
	        }
	        return VerySimpleReadOnlyString("", 0);
	    }
	    const int size = pos + find.length;
	    VerySimpleReadOnlyString ret(data, includeFind ? size : pos);
        (void)Mutate(data + size, length - size);
	    return ret;
	}